

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

void __thiscall mprpc::MpRpcClient::do_send_heartbeat(MpRpcClient *this)

{
  atomic<int> *paVar1;
  element_type *peVar2;
  int iVar3;
  uint64_t val;
  char local_89;
  MsgPackPacker pk;
  MsgPackPacker pk_params;
  
  iVar3 = (*((this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Connection[7])();
  if ((char)iVar3 != '\0') {
    LOCK();
    paVar1 = &this->m_cur_callid;
    iVar3 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pk_params.sb.size = 0;
    pk_params.sb.data = (char *)0x0;
    pk_params.sb.alloc = 0;
    pk_params.pk.callback = msgpack_sbuffer_write;
    pk.sb.size = CONCAT71(pk.sb.size._1_7_,0x81);
    pk_params.pk.data = &pk_params;
    msgpack_sbuffer_write(&pk_params,(char *)&pk,1);
    val = std::chrono::_V2::system_clock::now();
    MsgPackPacker::pack_map_item(&pk_params,"time",val);
    pk.sb.size = 0;
    pk.sb.data = (char *)0x0;
    pk.sb.alloc = 0;
    pk.pk.callback = msgpack_sbuffer_write;
    local_89 = -0x7d;
    pk.pk.data = &pk;
    msgpack_sbuffer_write(&pk,&local_89,1);
    MsgPackPacker::pack_map_item(&pk,"id",iVar3 + 1);
    MsgPackPacker::pack_map_item(&pk,"method",".sys.heartbeat");
    MsgPackPacker::pack_map_item_obj(&pk,"params",pk_params.sb.data,pk_params.sb.size);
    peVar2 = (this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Connection[5])(peVar2,pk.sb.data,pk.sb.size);
    free(pk.sb.data);
    free(pk_params.sb.data);
  }
  return;
}

Assistant:

void MpRpcClient::do_send_heartbeat()
    {
        if (!m_conn->is_connected()) return;

        int callid = ++m_cur_callid;

        MsgPackPacker pk_params;
        pk_params.pack_map(1);
        pk_params.pack_map_item("time", (uint64_t)system_clock::now().time_since_epoch().count());
         
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item    ("id",     callid);
        pk.pack_map_item    ("method", ".sys.heartbeat");
        pk.pack_map_item_obj("params", pk_params.sb.data, pk_params.sb.size);

        m_conn->send(pk.sb.data, pk.sb.size);
    }